

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O3

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenRegex(cmSourceGroup *this,string *name)

{
  cmSourceGroupInternals *pcVar1;
  pointer pcVar2;
  bool bVar3;
  cmSourceGroup *pcVar4;
  cmSourceGroup *pcVar5;
  cmSourceGroup *group;
  
  pcVar1 = (this->Internal)._M_t.
           super___uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>
           .super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl;
  pcVar5 = *(cmSourceGroup **)
            &(pcVar1->GroupChildren).
             super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>;
  pcVar2 = *(pointer *)
            ((long)&(pcVar1->GroupChildren).
                    super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_> + 8);
  while( true ) {
    if (pcVar5 == pcVar2) {
      bVar3 = cmsys::RegularExpression::find
                        (&this->GroupRegex,(name->_M_dataplus)._M_p,&(this->GroupRegex).regmatch);
      pcVar5 = (cmSourceGroup *)0x0;
      if (bVar3) {
        pcVar5 = this;
      }
      return pcVar5;
    }
    pcVar4 = MatchChildrenRegex(pcVar5,name);
    if (pcVar4 != (cmSourceGroup *)0x0) break;
    pcVar5 = pcVar5 + 1;
  }
  return pcVar4;
}

Assistant:

cmSourceGroup* cmSourceGroup::MatchChildrenRegex(const std::string& name)
{
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    cmSourceGroup* result = group.MatchChildrenRegex(name);
    if (result) {
      return result;
    }
  }
  if (this->MatchesRegex(name)) {
    return this;
  }

  return nullptr;
}